

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[7],int,unsigned_long>
          (Capturer *this,size_t index,char (*value) [7],int *values,unsigned_long *values_1)

{
  string local_50;
  unsigned_long *local_30;
  unsigned_long *values_local_1;
  int *values_local;
  char (*value_local) [7];
  size_t index_local;
  Capturer *this_local;
  
  local_30 = values_1;
  values_local_1 = (unsigned_long *)values;
  values_local = (int *)value;
  value_local = (char (*) [7])index;
  index_local = (size_t)this;
  Detail::stringify<char[7]>(&local_50,value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<int,unsigned_long>(this,(size_t)(*value_local + 1),(int *)values_local_1,local_30);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }